

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512bw_popcnt32_mask(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined1 (*pauVar7) [64];
  int i;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar33 [64];
  __m512i masks [16];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pauVar7 = &local_480;
  lVar8 = 0;
  do {
    lVar8 = lVar8 + 1;
    auVar12 = vpbroadcastd_avx512f();
    auVar12 = vmovdqa64_avx512f(auVar12);
    *pauVar7 = auVar12;
    pauVar7 = pauVar7 + 1;
  } while (lVar8 != 0x10);
  if (len < 0x20) {
    iVar6 = 0;
    auVar30 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar12 = vmovdqa64_avx512f(local_480);
    auVar30 = vmovdqa64_avx512f(local_440);
    auVar28 = vmovdqa64_avx512f(local_400);
    auVar29 = vmovdqa64_avx512f(local_3c0);
    auVar13 = vmovdqa64_avx512f(local_380);
    auVar14 = vmovdqa64_avx512f(local_340);
    auVar15 = vmovdqa64_avx512f(local_300);
    auVar16 = vmovdqa64_avx512f(local_2c0);
    auVar17 = vmovdqa64_avx512f(local_280);
    auVar18 = vmovdqa64_avx512f(local_240);
    auVar19 = vmovdqa64_avx512f(local_200);
    auVar20 = vmovdqa64_avx512f(local_1c0);
    auVar21 = vmovdqa64_avx512f(local_180);
    auVar22 = vmovdqa64_avx512f(local_140);
    auVar23 = vmovdqa64_avx512f(local_100);
    auVar24 = vmovdqa64_avx512f(local_c0);
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar32 = ZEXT1664((undefined1  [16])0x0);
    auVar10 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    auVar33 = ZEXT1664(auVar10);
    lVar8 = 0;
    iVar6 = 0;
    do {
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar8));
      lVar8 = lVar8 + 0x40;
      auVar26 = vpandq_avx512f(auVar12,auVar25);
      auVar27 = vpandq_avx512f(auVar18,auVar25);
      uVar1 = vpcmpeqw_avx512bw(auVar26,auVar12);
      auVar26 = vpandq_avx512f(auVar30,auVar25);
      uVar2 = vpcmpeqw_avx512bw(auVar26,auVar30);
      auVar26 = vpandq_avx512f(auVar28,auVar25);
      iVar6 = iVar6 + POPCOUNT((int)uVar1);
      uVar1 = vpcmpeqw_avx512bw(auVar26,auVar28);
      auVar26 = vpandq_avx512f(auVar29,auVar25);
      uVar3 = vpcmpeqw_avx512bw(auVar26,auVar29);
      auVar26 = vpandq_avx512f(auVar13,auVar25);
      uVar4 = vpcmpeqw_avx512bw(auVar26,auVar13);
      auVar26 = vpandq_avx512f(auVar14,auVar25);
      auVar10 = vpinsrd_avx512dq(ZEXT416((uint)uVar2),(int)uVar1,1);
      uVar1 = vpcmpeqw_avx512bw(auVar26,auVar14);
      auVar26 = vpandq_avx512f(auVar15,auVar25);
      auVar10 = vpinsrd_avx512dq(auVar10,(int)uVar3,2);
      uVar2 = vpcmpeqw_avx512bw(auVar26,auVar15);
      auVar26 = vpandq_avx512f(auVar16,auVar25);
      auVar10 = vpinsrd_avx512dq(auVar10,(int)uVar4,3);
      uVar3 = vpcmpeqw_avx512bw(auVar26,auVar16);
      auVar26 = vpandq_avx512f(auVar17,auVar25);
      uVar4 = vpcmpeqw_avx512bw(auVar26,auVar17);
      auVar5 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      uVar1 = vpcmpeqw_avx512bw(auVar27,auVar18);
      auVar5 = vpinsrd_avx512dq(auVar5,(int)uVar3,2);
      auVar5 = vpinsrd_avx512dq(auVar5,(int)uVar4,3);
      auVar11 = vinserti32x4_avx512vl(ZEXT1632(auVar10),auVar5,1);
      auVar26 = vpandq_avx512f(auVar22,auVar25);
      auVar11 = vpopcntd_avx512_vpopcntdq(auVar11);
      auVar11 = vpaddd_avx512vl(auVar11,auVar32._0_32_);
      auVar32 = ZEXT3264(auVar11);
      auVar27 = vpandq_avx512f(auVar19,auVar25);
      uVar2 = vpcmpeqw_avx512bw(auVar27,auVar19);
      auVar27 = vpandq_avx512f(auVar20,auVar25);
      uVar3 = vpcmpeqw_avx512bw(auVar27,auVar20);
      auVar27 = vpandq_avx512f(auVar21,auVar25);
      uVar4 = vpcmpeqw_avx512bw(auVar27,auVar21);
      auVar10 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      uVar1 = vpcmpeqw_avx512bw(auVar26,auVar22);
      auVar10 = vpinsrd_avx512dq(auVar10,(int)uVar3,2);
      auVar10 = vpinsrd_avx512dq(auVar10,(int)uVar4,3);
      auVar10 = vpopcntd_avx512_vpopcntdq(auVar10);
      auVar10 = vpaddd_avx512vl(auVar10,auVar31._0_16_);
      auVar31 = ZEXT1664(auVar10);
      auVar26 = vpandq_avx512f(auVar23,auVar25);
      auVar25 = vpandq_avx512f(auVar24,auVar25);
      uVar2 = vpcmpeqw_avx512bw(auVar26,auVar23);
      vpcmpeqw_avx512bw(auVar25,auVar24);
      auVar10 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      auVar10 = vpopcntd_avx512_vpopcntdq(auVar10);
      auVar10 = vpaddd_avx512vl(auVar10,auVar33._0_16_);
      auVar33 = ZEXT1664(auVar10);
    } while ((ulong)(len >> 5) << 6 != lVar8);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011a0d0);
    auVar28 = valignd_avx512f(auVar32,auVar32,0xf);
    auVar12._60_4_ = 0;
    auVar12._0_60_ = auVar28._4_60_;
    auVar12 = vpermi2d_avx512f(auVar30,auVar12 << 0x20,auVar31);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011a0e0);
    auVar12 = vpermi2d_avx512f(auVar30,auVar12,auVar33);
    auVar30 = vpbroadcastd_avx512f();
    auVar30._0_60_ = auVar12._0_60_;
  }
  auVar10 = vpinsrd_avx(auVar30._0_16_,iVar6,0);
  auVar12 = vinserti32x4_avx512f(auVar30,auVar10,0);
  if ((len & 0xffffffe0) != len) {
    auVar30 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar28 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = (ulong)(len & 0xffffffe0);
    do {
      uVar9 = uVar9 + 1;
      auVar29 = vpbroadcastd_avx512f();
      auVar29 = vpsrlvd_avx512f(auVar29,auVar30);
      auVar29 = vpandd_avx512f(auVar29,auVar28);
      auVar12 = vpaddd_avx512f(auVar29,auVar12);
    } while (uVar9 < len);
  }
  auVar12 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])flags = auVar12;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_popcnt32_mask(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm512_set1_epi32(((1 << i) << 16) | (1 << i));
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) out_counters[pos] += PIL_POPCOUNT((uint64_t)_mm512_cmpeq_epu16_mask(_mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]), masks[pos]));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (size_t i = 0; i < n_cycles; ++i) {
        BLOCK
    }

    // residual
    for (size_t i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef BLOCK
#undef UPDATE

    return 0;
}